

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void __thiscall Lexer::Lexer(Lexer *this)

{
  allocator local_9;
  
  this->npos = -1;
  std::__cxx11::string::string((string *)&this->input_,"",&local_9);
  this->index_ = 0;
  (this->position_).super_Position.row_ = 1;
  (this->position_).super_Position.col_ = 0;
  (this->position_).super_Position._vptr_Position = (_func_int **)&PTR_clear_00159970;
  this->in_row_comment_ = false;
  this->in_block_comment_ = false;
  this->current_ = this->npos;
  return;
}

Assistant:

Lexer::Lexer() : input_(""), index_(0), in_row_comment_(false), in_block_comment_(false) {
    current_ = npos;
}